

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

ImDrawList * __thiscall ImDrawList::CloneOutput(ImDrawList *this)

{
  ImDrawList *pIVar1;
  ImVector<ImDrawCmd> *in_RDI;
  ImDrawListSharedData *in_stack_00000008;
  ImDrawList *in_stack_00000010;
  ImDrawList *dst;
  ImVector<ImDrawCmd> *this_00;
  
  this_00 = (ImVector<ImDrawCmd> *)0xa8;
  ImGui::MemAlloc(0xa8);
  pIVar1 = (ImDrawList *)operator_new(this_00);
  ImDrawList(in_stack_00000010,in_stack_00000008);
  ImVector<ImDrawCmd>::operator=(this_00,in_RDI);
  ImVector<unsigned_short>::operator=
            ((ImVector<unsigned_short> *)this_00,(ImVector<unsigned_short> *)in_RDI);
  ImVector<ImDrawVert>::operator=((ImVector<ImDrawVert> *)this_00,(ImVector<ImDrawVert> *)in_RDI);
  pIVar1->Flags = in_RDI[3].Size;
  return pIVar1;
}

Assistant:

ImDrawList* ImDrawList::CloneOutput() const
{
    ImDrawList* dst = IM_NEW(ImDrawList(NULL));
    dst->CmdBuffer = CmdBuffer;
    dst->IdxBuffer = IdxBuffer;
    dst->VtxBuffer = VtxBuffer;
    dst->Flags = Flags;
    return dst;
}